

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

string * __thiscall
QPDFObjectHandle::getRealValue_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  string local_40;
  
  bVar1 = isReal(this);
  if (bVar1) {
    QPDFObject::getStringValue_abi_cxx11_
              (__return_storage_ptr__,
               (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"returning 0.0","");
    typeWarning(this,"real",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0.0","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getRealValue() const
{
    if (isReal()) {
        return obj->getStringValue();
    } else {
        typeWarning("real", "returning 0.0");
        QTC::TC("qpdf", "QPDFObjectHandle real returning 0.0");
        return "0.0";
    }
}